

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O0

void __thiscall
Js::JavascriptPromiseReaction::JavascriptPromiseReaction
          (JavascriptPromiseReaction *this,JavascriptPromiseCapability *capabilities,
          RecyclableObject *handler)

{
  RecyclableObject *handler_local;
  JavascriptPromiseCapability *capabilities_local;
  JavascriptPromiseReaction *this_local;
  
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e3b808;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::WriteBarrierPtr
            (&this->capabilities,capabilities);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->handler,handler);
  return;
}

Assistant:

JavascriptPromiseReaction(JavascriptPromiseCapability* capabilities, RecyclableObject* handler)
            : capabilities(capabilities), handler(handler)
        { }